

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.hpp
# Opt level: O0

void __thiscall inja::Renderer::visit(Renderer *this,IncludeStatementNode *node)

{
  ostream *os;
  bool bVar1;
  pointer ppVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  _Self local_180 [3];
  _Self local_168;
  const_iterator included_template_it;
  Renderer sub_renderer;
  IncludeStatementNode *node_local;
  Renderer *this_local;
  
  Renderer((Renderer *)&included_template_it,&this->config,this->template_storage,
           this->function_storage);
  local_168._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>_>
       ::find(this->template_storage,&node->file);
  local_180[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>_>
       ::end(this->template_storage);
  bVar1 = std::operator!=(&local_168,local_180);
  if (bVar1) {
    os = this->output_stream;
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>
             ::operator->(&local_168);
    render_to((Renderer *)&included_template_it,os,&ppVar2->second,this->data_input,
              &this->additional_data);
  }
  else if (((this->config).throw_at_missing_includes & 1U) != 0) {
    ::std::operator+(&local_1c0,"include \'",&node->file);
    ::std::operator+(&local_1a0,&local_1c0,"\' not found");
    throw_renderer_error(this,&local_1a0,(AstNode *)node);
    ::std::__cxx11::string::~string((string *)&local_1a0);
    ::std::__cxx11::string::~string((string *)&local_1c0);
  }
  ~Renderer((Renderer *)&included_template_it);
  return;
}

Assistant:

void visit(const IncludeStatementNode& node) {
    auto sub_renderer = Renderer(config, template_storage, function_storage);
    const auto included_template_it = template_storage.find(node.file);
    if (included_template_it != template_storage.end()) {
      sub_renderer.render_to(*output_stream, included_template_it->second, *data_input, &additional_data);
    } else if (config.throw_at_missing_includes) {
      throw_renderer_error("include '" + node.file + "' not found", node);
    }
  }